

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_md.c
# Opt level: O0

int md_gets(BIO *bp,char *buf,int size)

{
  int iVar1;
  int in_EDX;
  uchar *in_RSI;
  BIO *in_RDI;
  uint ret;
  EVP_MD_CTX *ctx;
  EVP_MD *in_stack_ffffffffffffffc8;
  uint local_2c;
  EVP_MD_CTX *local_28;
  int local_1c;
  uchar *local_18;
  uint local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_28 = (EVP_MD_CTX *)BIO_get_data(in_RDI);
  EVP_MD_CTX_get0_md(local_28);
  iVar1 = EVP_MD_get_size(in_stack_ffffffffffffffc8);
  if (local_1c < iVar1) {
    local_4 = 0;
  }
  else {
    iVar1 = EVP_DigestFinal_ex((EVP_MD_CTX *)local_28,local_18,&local_2c);
    if (iVar1 < 1) {
      local_4 = 0xffffffff;
    }
    else {
      local_4 = local_2c;
    }
  }
  return local_4;
}

Assistant:

static int md_gets(BIO *bp, char *buf, int size)
{
    EVP_MD_CTX *ctx;
    unsigned int ret;

    ctx = BIO_get_data(bp);

    if (size < EVP_MD_CTX_get_size(ctx))
        return 0;

    if (EVP_DigestFinal_ex(ctx, (unsigned char *)buf, &ret) <= 0)
        return -1;

    return (int)ret;
}